

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader.cpp
# Opt level: O1

void __thiscall COLLADASaxFWL::SceneLoader::~SceneLoader(SceneLoader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader._vptr_ExtraDataLoader =
       (_func_int **)&PTR__SceneLoader_00933630;
  pcVar2 = (this->mCurrentCharacterData)._M_dataplus._M_p;
  paVar1 = &(this->mCurrentCharacterData).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::tr1::
  _Hashtable<COLLADAFW::UniqueId,_COLLADAFW::UniqueId,_std::allocator<COLLADAFW::UniqueId>,_std::_Identity<COLLADAFW::UniqueId>,_std::equal_to<COLLADAFW::UniqueId>,_std::tr1::hash<COLLADAFW::UniqueId>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
  ::~_Hashtable((_Hashtable<COLLADAFW::UniqueId,_COLLADAFW::UniqueId,_std::allocator<COLLADAFW::UniqueId>,_std::_Identity<COLLADAFW::UniqueId>,_std::equal_to<COLLADAFW::UniqueId>,_std::tr1::hash<COLLADAFW::UniqueId>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                 *)&this->mBoundNodes);
  FilePartLoader::~FilePartLoader(&this->super_FilePartLoader);
  return;
}

Assistant:

SceneLoader::~SceneLoader ()
	{
	}